

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O1

void Saig_StrSimPrepareAig(Aig_Man_t *p)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  int *piVar4;
  int iVar5;
  undefined8 *puVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  long lVar9;
  
  Aig_ManReprStart(p,p->vObjs->nSize);
  iVar5 = p->vObjs->nSize;
  lVar9 = (long)iVar5;
  puVar2 = (undefined8 *)malloc(lVar9 * 0x48);
  if (0 < lVar9) {
    pvVar3 = puVar2 + lVar9;
    puVar6 = puVar2;
    do {
      *puVar6 = pvVar3;
      puVar6 = puVar6 + 1;
      pvVar3 = (void *)((long)pvVar3 + 0x40);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  piVar4 = (int *)malloc(0x10);
  piVar4[1] = iVar5;
  *piVar4 = iVar5;
  *(undefined8 **)(piVar4 + 2) = puVar2;
  p->pData2 = piVar4;
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      if (pVVar7->pArray[lVar9] != (void *)0x0) {
        if (*(int *)((long)p->pData2 + 4) <= lVar9) goto LAB_006ec6e2;
        *(undefined8 *)((long)pVVar7->pArray[lVar9] + 0x28) =
             *(undefined8 *)(*(long *)((long)p->pData2 + 8) + lVar9 * 8);
      }
      lVar9 = lVar9 + 1;
      pVVar7 = p->vObjs;
    } while (lVar9 < pVVar7->nSize);
  }
  puVar1 = (undefined4 *)(p->pConst1->field_5).pData;
  puVar1[0xc] = 0xffffffff;
  puVar1[0xd] = 0xffffffff;
  puVar1[0xe] = 0xffffffff;
  puVar1[0xf] = 0xffffffff;
  puVar1[8] = 0xffffffff;
  puVar1[9] = 0xffffffff;
  puVar1[10] = 0xffffffff;
  puVar1[0xb] = 0xffffffff;
  puVar1[4] = 0xffffffff;
  puVar1[5] = 0xffffffff;
  puVar1[6] = 0xffffffff;
  puVar1[7] = 0xffffffff;
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  if (0 < p->nRegs) {
    pVVar7 = p->vCis;
    iVar5 = 0;
    do {
      uVar8 = p->nTruePis + iVar5;
      if (((int)uVar8 < 0) || (pVVar7->nSize <= (int)uVar8)) {
LAB_006ec6e2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      **(undefined4 **)((long)pVVar7->pArray[uVar8] + 0x28) = 0;
      iVar5 = iVar5 + 1;
    } while (iVar5 < p->nRegs);
  }
  return;
}

Assistant:

void Saig_StrSimPrepareAig( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManReprStart( p, Aig_ManObjNumMax(p) );
    // allocate simulation info
    p->pData2 = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p), SAIG_WORDS );
    Aig_ManForEachObj( p, pObj, i )
        pObj->pData = Vec_PtrEntry( (Vec_Ptr_t *)p->pData2, i );
    // set simulation info for constant1 and register outputs
    Saig_StrSimAssignOne( Aig_ManConst1(p) );
    Saig_ManForEachLo( p, pObj, i )
        Saig_StrSimAssignZeroInit( pObj );
}